

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_filter.cpp
# Opt level: O3

FilterPropagateResult __thiscall
duckdb::IsNullFilter::CheckStatistics(IsNullFilter *this,BaseStatistics *stats)

{
  bool bVar1;
  FilterPropagateResult FVar2;
  
  bVar1 = BaseStatistics::CanHaveNull(stats);
  FVar2 = FILTER_ALWAYS_FALSE;
  if (bVar1) {
    bVar1 = BaseStatistics::CanHaveNoNull(stats);
    FVar2 = !bVar1;
  }
  return FVar2;
}

Assistant:

FilterPropagateResult IsNullFilter::CheckStatistics(BaseStatistics &stats) {
	if (!stats.CanHaveNull()) {
		// no null values are possible: always false
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	}
	if (!stats.CanHaveNoNull()) {
		// no non-null values are possible: always true
		return FilterPropagateResult::FILTER_ALWAYS_TRUE;
	}
	return FilterPropagateResult::NO_PRUNING_POSSIBLE;
}